

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall
ChainstateManager::ReportHeadersPresync
          (ChainstateManager *this,arith_uint256 *work,int64_t height,int64_t timestamp)

{
  CBlockIndex *pCVar1;
  Notifications *pNVar2;
  int64_t iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  time_point tVar7;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int64_t height_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  double progress;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock33.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock33.super_unique_lock._M_owns = false;
  height_local = height;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock33.super_unique_lock);
  pCVar1 = this->m_best_header;
  UintToArith256((arith_uint256 *)&progress,
                 &(((this->m_options).chainparams)->consensus).nMinimumChainWork);
  iVar5 = base_uint<256U>::CompareTo
                    (&(pCVar1->nChainWork).super_base_uint<256U>,(base_uint<256U> *)&progress);
  if (iVar5 < 0) {
    lVar6 = std::chrono::_V2::steady_clock::now();
    if ((this->m_last_presync_update).__d.__r + 250000000 <= lVar6) {
      (this->m_last_presync_update).__d.__r = lVar6;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
      bVar4 = IsInitialBlockDownload(this);
      iVar3 = height_local;
      pNVar2 = (this->m_options).notifications;
      uVar9 = 2;
      if (bVar4) {
        uVar9 = (ulong)((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1);
      }
      (*pNVar2->_vptr_Notifications[3])(pNVar2,uVar9,height_local,timestamp,1);
      if (bVar4) {
        tVar7 = NodeClock::now();
        lVar8 = ((long)tVar7.__d.__r + timestamp * -1000000000) /
                ((((this->m_options).chainparams)->consensus).nPowTargetSpacing * 1000000000);
        lVar6 = 0;
        if (0 < lVar8) {
          lVar6 = lVar8;
        }
        progress = ((double)iVar3 * 100.0) / (double)(lVar6 + iVar3);
        logging_function._M_str = "ReportHeadersPresync";
        logging_function._M_len = 0x14;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        LogPrintFormatInternal<long,double>
                  (logging_function,source_file,0x114e,ALL,Info,(ConstevalFormatString<2U>)0x80e8f3,
                   &height_local,&progress);
      }
      goto LAB_003fd0fc;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
LAB_003fd0fc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::ReportHeadersPresync(const arith_uint256& work, int64_t height, int64_t timestamp)
{
    AssertLockNotHeld(cs_main);
    {
        LOCK(cs_main);
        // Don't report headers presync progress if we already have a post-minchainwork header chain.
        // This means we lose reporting for potentially legitimate, but unlikely, deep reorgs, but
        // prevent attackers that spam low-work headers from filling our logs.
        if (m_best_header->nChainWork >= UintToArith256(GetConsensus().nMinimumChainWork)) return;
        // Rate limit headers presync updates to 4 per second, as these are not subject to DoS
        // protection.
        auto now = std::chrono::steady_clock::now();
        if (now < m_last_presync_update + std::chrono::milliseconds{250}) return;
        m_last_presync_update = now;
    }
    bool initial_download = IsInitialBlockDownload();
    GetNotifications().headerTip(GetSynchronizationState(initial_download, m_blockman.m_blockfiles_indexed), height, timestamp, /*presync=*/true);
    if (initial_download) {
        int64_t blocks_left{(NodeClock::now() - NodeSeconds{std::chrono::seconds{timestamp}}) / GetConsensus().PowTargetSpacing()};
        blocks_left = std::max<int64_t>(0, blocks_left);
        const double progress{100.0 * height / (height + blocks_left)};
        LogInfo("Pre-synchronizing blockheaders, height: %d (~%.2f%%)\n", height, progress);
    }
}